

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

int Llb_CoreReachability_int(Llb_Img_t *p,Vec_Ptr_t *vQuant0,Vec_Ptr_t *vQuant1)

{
  DdManager *pDVar1;
  FILE *pFVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  abctime aVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  abctime aVar10;
  Abc_Cex_t *pAVar11;
  double dVar12;
  double dVar13;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  double nMints_1;
  double nMints;
  int nBddSize;
  int nIters;
  abctime clk;
  abctime clk2;
  DdNode *bTemp;
  DdNode *bNext;
  DdNode *bReached;
  DdNode *bCurrent;
  int *pGlo2Loc;
  int *pLoc2GloR;
  int *pLoc2Glo;
  Vec_Ptr_t *vQuant1_local;
  Vec_Ptr_t *vQuant0_local;
  Llb_Img_t *p_local;
  
  if (p->pPars->fBackward == 0) {
    local_a0 = Vec_IntArray(p->vNs2Glo);
  }
  else {
    local_a0 = Vec_IntArray(p->vCs2Glo);
  }
  if (p->pPars->fBackward == 0) {
    local_a8 = Vec_IntArray(p->vCs2Glo);
  }
  else {
    local_a8 = Vec_IntArray(p->vNs2Glo);
  }
  if (p->pPars->fBackward == 0) {
    local_b0 = Vec_IntArray(p->vGlo2Cs);
  }
  else {
    local_b0 = Vec_IntArray(p->vGlo2Ns);
  }
  aVar6 = Abc_Clock();
  aVar7 = Abc_Clock();
  if (p->pPars->TimeTarget < aVar7) {
    if (p->pPars->fSilent == 0) {
      printf("Reached timeout (%d seconds) before image computation.\n",
             (ulong)(uint)p->pPars->TimeLimit);
    }
    p->pPars->iFrame = -1;
    return -1;
  }
  p->dd->TimeStop = p->pPars->TimeTarget;
  p->ddG->TimeStop = p->pPars->TimeTarget;
  p->ddR->TimeStop = p->pPars->TimeTarget;
  if (p->pPars->fBackward == 0) {
    pDVar8 = Llb_BddComputeBad(p->pInit,p->ddR,p->pPars->TimeTarget);
    p->ddR->bFunc = pDVar8;
    if (p->ddR->bFunc == (DdNode *)0x0) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) while computing bad states.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = -1;
      return -1;
    }
    Cudd_Ref(p->ddR->bFunc);
    bReached = Llb_CoreComputeCube(p->dd,p->vVarsCs,1,(char *)0x0);
    Cudd_Ref(bReached);
    bNext = Llb_CoreComputeCube(p->ddG,p->vVarsCs,0,(char *)0x0);
    Cudd_Ref(bNext);
  }
  else {
    pDVar8 = Llb_BddComputeBad(p->pInit,p->ddR,p->pPars->TimeTarget);
    if (pDVar8 == (DdNode *)0x0) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) while computing bad states.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = -1;
      return -1;
    }
    Cudd_Ref(pDVar8);
    pDVar9 = Llb_CoreComputeCube(p->ddR,p->vVarsCs,0,(char *)0x0);
    p->ddR->bFunc = pDVar9;
    Cudd_Ref(p->ddR->bFunc);
    pDVar9 = Llb_BddQuantifyPis(p->pInit,p->ddR,pDVar8);
    Cudd_Ref(pDVar9);
    Cudd_RecursiveDeref(p->ddR,pDVar8);
    bNext = Cudd_bddTransfer(p->ddR,p->ddG,pDVar9);
    Cudd_Ref(bNext);
    Cudd_RecursiveDeref(p->ddR,pDVar9);
    bReached = Extra_TransferPermute(p->ddG,p->dd,bNext,local_b0);
    if (bReached == (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->ddG,bNext);
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during transfer 0.\n",(ulong)(uint)p->pPars->TimeLimit)
        ;
      }
      p->pPars->iFrame = -1;
      return -1;
    }
    Cudd_Ref(bReached);
  }
  nMints._4_4_ = 0;
  do {
    if (p->pPars->nIterMax <= (int)nMints._4_4_) {
LAB_00a8ac62:
      if (bNext == (DdNode *)0x0) {
        p->pPars->iFrame = nMints._4_4_ - 1;
        p_local._4_4_ = 0;
      }
      else {
        if (bReached != (DdNode *)0x0) {
          Cudd_RecursiveDeref(p->dd,bReached);
        }
        if (p->pPars->fVerbose != 0) {
          pDVar1 = p->ddG;
          iVar3 = Saig_ManRegNum(p->pAig);
          dVar12 = Cudd_CountMinterm(pDVar1,bNext,iVar3);
          if ((int)nMints._4_4_ < p->pPars->nIterMax) {
            fprintf(_stdout,"Reachability analysis completed after %d frames.\n",(ulong)nMints._4_4_
                   );
          }
          else {
            fprintf(_stdout,"Reachability analysis is stopped after %d frames.\n",
                    (ulong)nMints._4_4_);
          }
          pFVar2 = _stdout;
          iVar3 = Saig_ManRegNum(p->pAig);
          dVar13 = pow(2.0,(double)iVar3);
          fprintf(pFVar2,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar12,
                  (dVar12 * 100.0) / dVar13);
          fflush(_stdout);
        }
        if (p->pPars->fDumpReached != 0) {
          Llb_ManDumpReached(p->ddG,bNext,p->pAig->pName,"reached.blif");
          uVar4 = Cudd_DagSize(bNext);
          printf("Reached states with %d BDD nodes are dumpted into file \"reached.blif\".\n",
                 (ulong)uVar4);
        }
        Cudd_RecursiveDeref(p->ddG,bNext);
        if ((int)nMints._4_4_ < p->pPars->nIterMax) {
          if (p->pPars->fSilent == 0) {
            printf("The miter is proved unreachable after %d iterations.  ",(ulong)nMints._4_4_);
            aVar7 = Abc_Clock();
            Abc_PrintTime(1,"Time",aVar7 - aVar6);
          }
          p->pPars->iFrame = nMints._4_4_ - 1;
          p_local._4_4_ = 1;
        }
        else {
          if (p->pPars->fSilent == 0) {
            printf("Verified only for states reachable in %d frames.  ",(ulong)nMints._4_4_);
            aVar7 = Abc_Clock();
            Abc_PrintTime(1,"Time",aVar7 - aVar6);
          }
          p->pPars->iFrame = p->pPars->nIterMax;
          p_local._4_4_ = -1;
        }
      }
      return p_local._4_4_;
    }
    aVar7 = Abc_Clock();
    if ((p->pPars->TimeLimit != 0) && (aVar10 = Abc_Clock(), p->pPars->TimeTarget < aVar10)) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during image computation.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = nMints._4_4_ - 1;
      Cudd_RecursiveDeref(p->dd,bReached);
      Cudd_RecursiveDeref(p->ddG,bNext);
      return -1;
    }
    pDVar8 = Extra_TransferPermute(p->dd,p->ddR,bReached,local_a8);
    if (pDVar8 == (DdNode *)0x0) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during image computation.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = nMints._4_4_ - 1;
      Cudd_RecursiveDeref(p->dd,bReached);
      Cudd_RecursiveDeref(p->ddG,bNext);
      return -1;
    }
    Cudd_Ref(pDVar8);
    Vec_PtrPush(p->vRings,pDVar8);
    if ((p->pPars->fSkipOutCheck == 0) &&
       (iVar3 = Cudd_bddLeq(p->ddR,pDVar8,(DdNode *)((ulong)p->ddR->bFunc ^ 1)), iVar3 == 0)) {
      if (p->pInit->pSeqModel == (Abc_Cex_t *)0x0) {
        if (p->pPars->fBackward == 0) {
          pAVar11 = Llb_CoreDeriveCex(p);
          p->pInit->pSeqModel = pAVar11;
        }
        Cudd_RecursiveDeref(p->dd,bReached);
        Cudd_RecursiveDeref(p->ddG,bNext);
        if (p->pPars->fSilent == 0) {
          if (p->pPars->fBackward == 0) {
            Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)(uint)p->pInit->pSeqModel->iPo,p->pInit->pName,(ulong)nMints._4_4_);
          }
          else {
            Abc_Print(1,"Output ??? was asserted in frame %d (counter-example is not produced).  ",
                      (ulong)nMints._4_4_);
          }
          aVar7 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar7 - aVar6);
        }
        p->pPars->iFrame = nMints._4_4_ - 1;
        return 0;
      }
      __assert_fail("p->pInit->pSeqModel == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Core.c"
                    ,0x13e,"int Llb_CoreReachability_int(Llb_Img_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    pDVar8 = Llb_ImgComputeImage(p->pAig,p->vDdMans,p->dd,bReached,vQuant0,vQuant1,p->vDriRefs,
                                 p->pPars->TimeTarget,p->pPars->fBackward,p->pPars->fReorder,
                                 p->pPars->fVeryVerbose);
    if (pDVar8 == (DdNode *)0x0) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during image computation.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = nMints._4_4_ - 1;
      Cudd_RecursiveDeref(p->dd,bReached);
      Cudd_RecursiveDeref(p->ddG,bNext);
      return -1;
    }
    Cudd_Ref(pDVar8);
    Cudd_RecursiveDeref(p->dd,bReached);
    bReached = (DdNode *)0x0;
    pDVar9 = Extra_TransferPermute(p->dd,p->ddG,pDVar8,local_a0);
    if (pDVar9 == (DdNode *)0x0) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = nMints._4_4_ - 1;
      Cudd_RecursiveDeref(p->dd,pDVar8);
      Cudd_RecursiveDeref(p->ddG,bNext);
      return -1;
    }
    Cudd_Ref(pDVar9);
    Cudd_RecursiveDeref(p->dd,pDVar8);
    uVar4 = Cudd_DagSize(pDVar9);
    iVar3 = Cudd_bddLeq(p->ddG,pDVar9,bNext);
    if (iVar3 != 0) {
      Cudd_RecursiveDeref(p->ddG,pDVar9);
      goto LAB_00a8ac62;
    }
    pDVar8 = Cudd_bddAnd(p->ddG,pDVar9,(DdNode *)((ulong)bNext ^ 1));
    if (pDVar8 == (DdNode *)0x0) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = nMints._4_4_ - 1;
      Cudd_RecursiveDeref(p->ddG,pDVar9);
      Cudd_RecursiveDeref(p->ddG,bNext);
      return -1;
    }
    Cudd_Ref(pDVar8);
    bReached = Extra_TransferPermute(p->ddG,p->dd,pDVar8,local_b0);
    if (bReached == (DdNode *)0x0) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = nMints._4_4_ - 1;
      Cudd_RecursiveDeref(p->ddG,pDVar8);
      Cudd_RecursiveDeref(p->ddG,bNext);
      return -1;
    }
    Cudd_Ref(bReached);
    Cudd_RecursiveDeref(p->ddG,pDVar8);
    pDVar8 = Cudd_bddOr(p->ddG,bNext,pDVar9);
    Cudd_Ref(pDVar8);
    Cudd_RecursiveDeref(p->ddG,bNext);
    Cudd_RecursiveDeref(p->ddG,pDVar9);
    if (p->pPars->fVeryVerbose != 0) {
      pDVar1 = p->ddG;
      iVar3 = Saig_ManRegNum(p->pAig);
      dVar12 = Cudd_CountMinterm(pDVar1,pDVar8,iVar3);
      pFVar2 = _stdout;
      iVar3 = Saig_ManRegNum(p->pAig);
      dVar13 = pow(2.0,(double)iVar3);
      fprintf(pFVar2,"        Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar12,
              (dVar12 * 100.0) / dVar13);
      fflush(_stdout);
    }
    if (p->pPars->fVerbose != 0) {
      fprintf(_stdout,"F =%3d : ",(ulong)nMints._4_4_);
      fprintf(_stdout,"Image =%6d  ",(ulong)uVar4);
      pFVar2 = _stdout;
      uVar4 = Cudd_ReadReorderings(p->dd);
      uVar5 = Cudd_ReadGarbageCollections(p->dd);
      fprintf(pFVar2,"(%4d%4d)  ",(ulong)uVar4,(ulong)uVar5);
      pFVar2 = _stdout;
      uVar4 = Cudd_DagSize(pDVar8);
      fprintf(pFVar2,"Reach =%6d  ",(ulong)uVar4);
      pFVar2 = _stdout;
      uVar4 = Cudd_ReadReorderings(p->ddG);
      uVar5 = Cudd_ReadGarbageCollections(p->ddG);
      fprintf(pFVar2,"(%4d%4d)  ",(ulong)uVar4,(ulong)uVar5);
      aVar10 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar10 - aVar7);
    }
    if (nMints._4_4_ == p->pPars->nIterMax - 1U) {
      if (p->pPars->fSilent == 0) {
        printf("Reached limit on the number of timeframes (%d).\n",(ulong)(uint)p->pPars->nIterMax);
      }
      p->pPars->iFrame = nMints._4_4_;
      Cudd_RecursiveDeref(p->dd,bReached);
      Cudd_RecursiveDeref(p->ddG,pDVar8);
      return -1;
    }
    nMints._4_4_ = nMints._4_4_ + 1;
    bNext = pDVar8;
  } while( true );
}

Assistant:

int Llb_CoreReachability_int( Llb_Img_t * p, Vec_Ptr_t * vQuant0, Vec_Ptr_t * vQuant1 )
{
    int * pLoc2Glo  = p->pPars->fBackward? Vec_IntArray( p->vCs2Glo ) : Vec_IntArray( p->vNs2Glo );
    int * pLoc2GloR = p->pPars->fBackward? Vec_IntArray( p->vNs2Glo ) : Vec_IntArray( p->vCs2Glo );
    int * pGlo2Loc  = p->pPars->fBackward? Vec_IntArray( p->vGlo2Ns ) : Vec_IntArray( p->vGlo2Cs );
    DdNode * bCurrent, * bReached, * bNext, * bTemp;
    abctime clk2, clk = Abc_Clock();
    int nIters, nBddSize;//, iOutFail = -1;
/*
    // compute time to stop
    if ( p->pPars->TimeLimit )
        p->pPars->TimeTarget = Abc_Clock() + p->pPars->TimeLimit * CLOCKS_PER_SEC;
    else
        p->pPars->TimeTarget = 0;
*/

    if ( Abc_Clock() > p->pPars->TimeTarget )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) before image computation.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // compute initial states
    if ( p->pPars->fBackward )
    {
        // create init state in the global manager
        bTemp = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );   
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) while computing bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( bTemp );
        // create bad state in the ring manager
        p->ddR->bFunc = Llb_CoreComputeCube( p->ddR, p->vVarsCs, 0, NULL );      Cudd_Ref( p->ddR->bFunc );
        bCurrent = Llb_BddQuantifyPis( p->pInit, p->ddR, bTemp );                Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddR, bTemp );
        bReached = Cudd_bddTransfer( p->ddR, p->ddG, bCurrent );                 Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddR, bCurrent );
        // move init state to the working manager
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bReached, pGlo2Loc );   
        if ( bCurrent == NULL )
        {
            Cudd_RecursiveDeref( p->ddG, bReached );
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during transfer 0.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( bCurrent );
    }
    else
    {
        // create bad state in the ring manager
        p->ddR->bFunc = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );  
        if ( p->ddR->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) while computing bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( p->ddR->bFunc );
        // create init state in the working and global manager
        bCurrent = Llb_CoreComputeCube( p->dd,  p->vVarsCs, 1, NULL );           Cudd_Ref( bCurrent );
        bReached = Llb_CoreComputeCube( p->ddG, p->vVarsCs, 0, NULL );           Cudd_Ref( bReached );
//Extra_bddPrint( p->dd, bCurrent );  printf( "\n" );
//Extra_bddPrint( p->ddG, bReached );  printf( "\n" );
    }

    // compute onion rings
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clk2 = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, bCurrent, pLoc2GloR );  
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pInit->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pInit->pSeqModel = Llb_CoreDeriveCex( p ); 
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pInit->pSeqModel->iPo, p->pInit->pName, nIters );
                else
                    Abc_Print( 1, "Output ??? was asserted in frame %d (counter-example is not produced).  ", nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            return 0;
        }

        // compute the next states
        bNext = Llb_ImgComputeImage( p->pAig, p->vDdMans, p->dd, bCurrent, 
            vQuant0, vQuant1, p->vDriRefs, p->pPars->TimeTarget, 
            p->pPars->fBackward, p->pPars->fReorder, p->pPars->fVeryVerbose );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );   bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bCurrent );        bCurrent = NULL;
//Extra_bddPrintSupport( p->dd, bNext ); printf( "\n" );

        // remap these states into the global manager
//        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pLoc2Glo );    Cudd_Ref( bNext );
//        Cudd_RecursiveDeref( p->dd, bTemp );

//        bNext = Extra_TransferPermuteTime( p->dd, p->ddG, bTemp = bNext, pLoc2Glo, p->pPars->TimeTarget );    
        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pLoc2Glo );    
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bTemp );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bTemp );  

        nBddSize = Cudd_DagSize(bNext);
        // check if there are any new states
        if ( Cudd_bddLeq( p->ddG, bNext, bReached ) ) // implication = no new states
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // get the new states
        bCurrent = Cudd_bddAnd( p->ddG, bNext, Cudd_Not(bReached) );                    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bNext );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );

        // remap these states into the current state vars
//        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc );   Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );

//        bCurrent = Extra_TransferPermuteTime( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc, p->pPars->TimeTarget );    
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Loc );    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddG, bTemp );

        // add to the reached states
        bReached = Cudd_bddOr( p->ddG, bTemp = bReached, bNext );                       Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        Cudd_RecursiveDeref( p->ddG, bNext );
        bNext = NULL;

        if ( p->pPars->fVeryVerbose )
        {
            double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->ddG, bReached );printf( "\n" );
            fprintf( stdout, "        Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
        if ( p->pPars->fVerbose )
        {
            fprintf( stdout, "F =%3d : ",    nIters );
            fprintf( stdout, "Image =%6d  ", nBddSize );
            fprintf( stdout, "(%4d%4d)  ", 
                Cudd_ReadReorderings(p->dd),  Cudd_ReadGarbageCollections(p->dd) );
            fprintf( stdout, "Reach =%6d  ", Cudd_DagSize(bReached) );
            fprintf( stdout, "(%4d%4d)  ", 
                Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }

        // check timeframe limit
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
    }
    if ( bReached == NULL )
    {
        p->pPars->iFrame = nIters - 1;
        return 0; // reachable
    }
    if ( bCurrent )
        Cudd_RecursiveDeref( p->dd, bCurrent );
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( p->pPars->fDumpReached )
    {
        Llb_ManDumpReached( p->ddG, bReached, p->pAig->pName, "reached.blif" );
        printf( "Reached states with %d BDD nodes are dumpted into file \"reached.blif\".\n", Cudd_DagSize(bReached) );
    }
    Cudd_RecursiveDeref( p->ddG, bReached );
    if ( nIters >= p->pPars->nIterMax )
    {
        if ( !p->pPars->fSilent )
        {
            printf( "Verified only for states reachable in %d frames.  ", nIters );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    if ( !p->pPars->fSilent )
    {
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}